

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O2

uint8_t plot::ansi::detail::find_color256(Color c)

{
  Color32 c_00;
  long lVar1;
  detail *in_RSI;
  uint8_t uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Color local_60;
  ansi_palette_entry ansi_clr;
  Color c_local;
  
  c_local = c;
  find_palette_entry(&ansi_clr,in_RSI,c);
  c_00 = Color::color32(&c_local,'\x05',0xff);
  fVar5 = c_local.b * 0.11 + c_local.r * 0.3 + c_local.g * 0.59;
  fVar5 = (float)(-(uint)(0.0 <= fVar5) & (uint)fVar5);
  if (1.0 <= fVar5) {
    fVar5 = 1.0;
  }
  lVar1 = lroundf(fVar5 * 23.0);
  fVar5 = Color::distance(&ansi_clr.first,&c_local);
  Color::Color(&local_60,c_00,'\x05',0xff);
  fVar3 = Color::distance(&local_60,&c_local);
  Color::Color(&local_60,(Color32)(((uint)lVar1 & 0xff) * 0x10101 | 0xff000000),'\x17',0xff);
  fVar4 = Color::distance(&local_60,&c_local);
  if ((fVar5 < fVar3) || (fVar4 < fVar3)) {
    if (fVar4 <= fVar5) {
      uVar2 = (char)lVar1 + 0xe8;
    }
    else {
      uVar2 = ansi_clr.second.second * '\b' + (char)ansi_clr.second.first;
    }
  }
  else {
    uVar2 = c_00.g * '\x06' + c_00.r * '$' + c_00.b + '\x10';
  }
  return uVar2;
}

Assistant:

inline std::uint8_t find_color256(plot::Color c) {
            using utils::clamp;
            auto ansi_clr = find_palette_entry(c);
            auto color = c.color32(5);
            std::uint8_t gray = std::lround(clamp(0.3f*c.r + 0.59f*c.g + 0.11f*c.b, 0.0f, 1.0f)*23);

            auto ansi_dist = ansi_clr.first.distance(c);
            auto color_dist = plot::Color(color, 5).distance(c);
            auto gray_dist = plot::Color({ gray, gray, gray, 255 }, 23).distance(c);

            if (color_dist <= gray_dist && color_dist <= ansi_dist) {
                return 16 + 36*color.r + 6*color.g + color.b;
            } else if (gray_dist <= ansi_dist) {
                return gray + 0xe8;
            } else {
                return ansi_clr.second.first + 8*ansi_clr.second.second;
            }
        }